

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O0

void __thiscall QFileSystemEntry::resolveFilePath(QFileSystemEntry *this)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QString::isEmpty((QString *)0x1290b9);
  if ((bVar2) && (bVar2 = QByteArray::isEmpty((QByteArray *)0x1290cc), !bVar2)) {
    QFile::decodeName((QByteArray *)in_RDI);
    QDir::fromNativeSeparators(in_RDI);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x129109);
    QString::~QString((QString *)0x129113);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemEntry::resolveFilePath() const
{
    if (m_filePath.isEmpty() && !m_nativeFilePath.isEmpty()) {
#ifdef Q_OS_WIN
        m_filePath = QDir::fromNativeSeparators(m_nativeFilePath);
#else
        m_filePath = QDir::fromNativeSeparators(QFile::decodeName(m_nativeFilePath));
#endif
    }
}